

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

void __thiscall
QMap<QByteArray,_QByteArray>::insert
          (QMap<QByteArray,_QByteArray> *this,QMap<QByteArray,_QByteArray> *map)

{
  QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
  *pQVar1;
  long in_FS_OFFSET;
  Map copy;
  undefined1 local_58 [16];
  _Link_type local_48;
  _Base_ptr p_Stack_40;
  _Base_ptr local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (map->d).d.ptr;
  if ((pQVar1 != (QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    detach(this);
    local_38 = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = (_Link_type)&DAT_aaaaaaaaaaaaaaaa;
    p_Stack_40 = (_Base_ptr)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    std::
    _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
    ::_Rb_tree((_Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
                *)local_58,&(((map->d).d.ptr)->m)._M_t);
    std::
    _Rb_tree<QByteArray,std::pair<QByteArray_const,QByteArray>,std::_Select1st<std::pair<QByteArray_const,QByteArray>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
    ::_M_merge_unique<std::less<QByteArray>>
              ((_Rb_tree<QByteArray,std::pair<QByteArray_const,QByteArray>,std::_Select1st<std::pair<QByteArray_const,QByteArray>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
                *)local_58,&(((this->d).d.ptr)->m)._M_t);
    std::
    map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
    ::operator=(&((this->d).d.ptr)->m,
                (map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
                 *)local_58);
    std::
    _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
    ::_M_erase((_Rb_tree<QByteArray,_std::pair<const_QByteArray,_QByteArray>,_std::_Select1st<std::pair<const_QByteArray,_QByteArray>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
                *)local_58,local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(const QMap<Key, T> &map)
    {
        // TODO: improve. In case of assignment, why copying first?
        if (map.isEmpty())
            return;

        detach();

#ifdef __cpp_lib_node_extract
        auto copy = map.d->m;
        copy.merge(std::move(d->m));
        d->m = std::move(copy);
#else
        // this is a std::copy, but we can't use std::inserter (need insert_or_assign...).
        // copy in reverse order, trying to make effective use of insertionHint.
        auto insertionHint = d->m.end();
        auto mapIt = map.d->m.crbegin();
        auto end = map.d->m.crend();
        for (; mapIt != end; ++mapIt)
            insertionHint = d->m.insert_or_assign(insertionHint, mapIt->first, mapIt->second);
#endif
    }